

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O2

void init_global(baseline *data)

{
  size_t *psVar1;
  vw *pvVar2;
  uint32_t *puVar3;
  
  if (data->global_only == true) {
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)data->ec,&constant_namespace);
    pvVar2 = data->all;
    puVar3 = &(pvVar2->weights).dense_weights._stride_shift;
    if ((pvVar2->weights).sparse != false) {
      puVar3 = &(pvVar2->weights).sparse_weights._stride_shift;
    }
    features::push_back((data->ec->super_example_predict).feature_space + 0x80,1.0,
                        (ulong)pvVar2->wpp * 0xb1c54b << ((byte)*puVar3 & 0x3f));
    data->ec->total_sum_feat_sq = data->ec->total_sum_feat_sq + 1.0;
    psVar1 = &data->ec->num_features;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void init_global(baseline& data)
{
  if (!data.global_only)
    return;
  // use a separate global constant
  data.ec->indices.push_back(constant_namespace);
  // different index from constant to avoid conflicts
  data.ec->feature_space[constant_namespace].push_back(
      1, ((constant - 17) * data.all->wpp) << data.all->weights.stride_shift());
  data.ec->total_sum_feat_sq++;
  data.ec->num_features++;
}